

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O1

int CreateMux(char *filename,WebPMux **mux)

{
  int iVar1;
  WebPMux *pWVar2;
  WebPData bitstream;
  WebPData local_38;
  
  iVar1 = ExUtilReadFileToWebPData(filename,&local_38);
  if (iVar1 == 0) {
    iVar1 = 0;
  }
  else {
    iVar1 = 1;
    pWVar2 = WebPMuxCreateInternal(&local_38,1,0x109);
    *mux = pWVar2;
    WebPFree(local_38.bytes);
    local_38.bytes = (uint8_t *)0x0;
    local_38.size = 0;
    if (*mux == (WebPMux *)0x0) {
      iVar1 = 0;
      fprintf(_stderr,"Failed to create mux object from file %s.\n",filename);
    }
  }
  return iVar1;
}

Assistant:

static int CreateMux(const char* const filename, WebPMux** mux) {
  WebPData bitstream;
  assert(mux != NULL);
  if (!ExUtilReadFileToWebPData(filename, &bitstream)) return 0;
  *mux = WebPMuxCreate(&bitstream, 1);
  WebPDataClear(&bitstream);
  if (*mux != NULL) return 1;
  WFPRINTF(stderr, "Failed to create mux object from file %s.\n",
           (const W_CHAR*)filename);
  return 0;
}